

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cc
# Opt level: O2

void version(int argc,char **argv)

{
  long lVar1;
  ostream *poVar2;
  string argv0;
  allocator local_28 [32];
  
  std::__cxx11::string::string((string *)&argv0,*argv,local_28);
  lVar1 = std::__cxx11::string::rfind((char)&argv0,0x2f);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_28,(ulong)&argv0);
    std::__cxx11::string::operator=((string *)&argv0,(string *)local_28);
    std::__cxx11::string::~string((string *)local_28);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&argv0);
  poVar2 = std::operator<<(poVar2," -- ");
  poVar2 = std::operator<<(poVar2,"1a02b19");
  poVar2 = std::operator<<(poVar2," (");
  poVar2 = std::operator<<(poVar2,"Sat, 9 Apr 2022 11:08:45 -0700");
  poVar2 = std::operator<<(poVar2,")");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Part of goestools (https://github.com/pietern/goestools)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Written by Pieter Noordhuis and contributors");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&argv0);
  return;
}

Assistant:

void version(int argc, char** argv) {
  std::string argv0(argv[0]);
  auto pos = argv0.rfind('/');
  if (pos != std::string::npos) {
    argv0 = argv0.substr(pos + 1);
  }

  std::cout
    << argv0
    << " -- " << GIT_COMMIT_HASH
    << " (" << GIT_COMMIT_DATE << ")"
    << std::endl
    << std::endl;
  std::cout
    << "Part of goestools (https://github.com/pietern/goestools)"
    << std::endl;
  std::cout
    << "Written by Pieter Noordhuis and contributors"
    << std::endl;
}